

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

void __thiscall absl::lts_20240722::Mutex::Fer(Mutex *this,PerThreadSynch *w)

{
  SynchWaitParams *pSVar1;
  ulong mu;
  long lVar2;
  uint uVar3;
  ulong mu_00;
  PerThreadSynch *pPVar4;
  SynchEvent *pSVar5;
  int mode;
  ulong in_RDX;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  PerThreadSynch *unaff_RBX;
  PerThreadSynch *head;
  char *pcVar6;
  synchronization_internal *this_00;
  bool bVar7;
  
  pSVar1 = w->waitp;
  head = (PerThreadSynch *)this;
  if (pSVar1->cond == (Condition *)0x0) {
    if (pSVar1->cv_word == (atomic<long> *)0x0) {
      (pSVar1->timeout).rep_ = 0xffffffffffffffff;
      this_00 = (synchronization_internal *)0x0;
      do {
        mode = (int)in_RDX;
        mu = (this->mu_).super___atomic_base<long>._M_i;
        if (((w->waitp->how != (MuHow)kSharedS | 8) & (uint)mu) == 0) {
          w->next = (PerThreadSynch *)0x0;
          (w->state)._M_i = kAvailable;
          AbslInternalPerThreadSemPost_lts_20240722((ThreadIdentity *)w);
          in_RDX = extraout_RDX;
LAB_0010ac95:
          bVar7 = false;
        }
        else {
          if ((mu & 0x44) == 0) {
            head = (PerThreadSynch *)0x0;
            pPVar4 = Enqueue((PerThreadSynch *)0x0,w->waitp,mu,6);
            mode = (int)extraout_RDX_00;
            if (pPVar4 == (PerThreadSynch *)0x0) {
              Fer();
LAB_0010acc2:
              Fer();
              unaff_RBX = w;
              goto LAB_0010acc7;
            }
            LOCK();
            bVar7 = mu == (this->mu_).super___atomic_base<long>._M_i;
            if (bVar7) {
              (this->mu_).super___atomic_base<long>._M_i =
                   (ulong)((uint)mu & 0xbb) | (ulong)pPVar4 | 4;
            }
            UNLOCK();
            in_RDX = extraout_RDX_00;
            if (bVar7) goto LAB_0010ac95;
          }
          else if ((mu & 0x40) == 0) {
            LOCK();
            mu_00 = (this->mu_).super___atomic_base<long>._M_i;
            bVar7 = mu == mu_00;
            if (bVar7) {
              (this->mu_).super___atomic_base<long>._M_i = mu | 0x44;
              mu_00 = mu;
            }
            UNLOCK();
            if (bVar7) {
              head = (PerThreadSynch *)(mu_00 & 0xffffffffffffff00);
              pPVar4 = Enqueue(head,w->waitp,mu_00,6);
              if (pPVar4 == (PerThreadSynch *)0x0) goto LAB_0010acc2;
              do {
                lVar2 = (this->mu_).super___atomic_base<long>._M_i;
                in_RDX = (ulong)((uint)lVar2 & 0xbb) | (ulong)pPVar4 | 4;
                LOCK();
                bVar7 = lVar2 == (this->mu_).super___atomic_base<long>._M_i;
                if (bVar7) {
                  (this->mu_).super___atomic_base<long>._M_i = in_RDX;
                }
                UNLOCK();
              } while (!bVar7);
              goto LAB_0010ac95;
            }
          }
          uVar3 = synchronization_internal::MutexDelay(this_00,1,mode);
          this_00 = (synchronization_internal *)(ulong)uVar3;
          bVar7 = true;
          in_RDX = extraout_RDX_01;
        }
        if (!bVar7) {
          return;
        }
      } while( true );
    }
  }
  else {
LAB_0010acc7:
    Fer();
  }
  Fer();
  if (((((atomic<long> *)&head->next)->super___atomic_base<long>)._M_i & 8U) == 0) {
    pSVar5 = GetSynchEvent(head);
    pcVar6 = "";
    if (pSVar5 != (SynchEvent *)0x0) {
      pcVar6 = pSVar5->name;
    }
    absl::lts_20240722::raw_log_internal::RawLog
              (kFatal,"mutex.cc",0x9aa,"thread should hold write lock on Mutex %p %s",head,pcVar6,
               unaff_RBX);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/synchronization/mutex.cc"
                  ,0x9aa,"void absl::Mutex::AssertHeld() const");
  }
  return;
}

Assistant:

void Mutex::Fer(PerThreadSynch* w) {
  SchedulingGuard::ScopedDisable disable_rescheduling;
  int c = 0;
  ABSL_RAW_CHECK(w->waitp->cond == nullptr,
                 "Mutex::Fer while waiting on Condition");
  ABSL_RAW_CHECK(w->waitp->cv_word == nullptr,
                 "Mutex::Fer with pending CondVar queueing");
  // The CondVar timeout is not relevant for the Mutex wait.
  w->waitp->timeout = {};
  for (;;) {
    intptr_t v = mu_.load(std::memory_order_relaxed);
    // Note: must not queue if the mutex is unlocked (nobody will wake it).
    // For example, we can have only kMuWait (conditional) or maybe
    // kMuWait|kMuWrWait.
    // conflicting != 0 implies that the waking thread cannot currently take
    // the mutex, which in turn implies that someone else has it and can wake
    // us if we queue.
    const intptr_t conflicting =
        kMuWriter | (w->waitp->how == kShared ? 0 : kMuReader);
    if ((v & conflicting) == 0) {
      w->next = nullptr;
      w->state.store(PerThreadSynch::kAvailable, std::memory_order_release);
      IncrementSynchSem(this, w);
      return;
    } else {
      if ((v & (kMuSpin | kMuWait)) == 0) {  // no waiters
        // This thread tries to become the one and only waiter.
        PerThreadSynch* new_h =
            Enqueue(nullptr, w->waitp, v, kMuIsCond | kMuIsFer);
        ABSL_RAW_CHECK(new_h != nullptr,
                       "Enqueue failed");  // we must queue ourselves
        if (mu_.compare_exchange_strong(
                v, reinterpret_cast<intptr_t>(new_h) | (v & kMuLow) | kMuWait,
                std::memory_order_release, std::memory_order_relaxed)) {
          return;
        }
      } else if ((v & kMuSpin) == 0 &&
                 mu_.compare_exchange_strong(v, v | kMuSpin | kMuWait)) {
        PerThreadSynch* h = GetPerThreadSynch(v);
        PerThreadSynch* new_h = Enqueue(h, w->waitp, v, kMuIsCond | kMuIsFer);
        ABSL_RAW_CHECK(new_h != nullptr,
                       "Enqueue failed");  // we must queue ourselves
        do {
          v = mu_.load(std::memory_order_relaxed);
        } while (!mu_.compare_exchange_weak(
            v,
            (v & kMuLow & ~kMuSpin) | kMuWait |
                reinterpret_cast<intptr_t>(new_h),
            std::memory_order_release, std::memory_order_relaxed));
        return;
      }
    }
    c = synchronization_internal::MutexDelay(c, GENTLE);
  }
}